

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api_layer_interface.cpp
# Opt level: O2

XrResult ApiLayerInterface::GetApiLayerProperties
                   (string *openxr_command,uint32_t incoming_count,uint32_t *outgoing_count,
                   XrApiLayerProperties *api_layer_properties)

{
  long lVar1;
  XrResult XVar2;
  long lVar3;
  XrResult XVar4;
  ulong uVar5;
  uint32_t prop;
  ulong uVar6;
  allocator local_aa;
  allocator local_a9;
  string local_a8;
  string local_88;
  vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> local_68;
  vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
  manifest_files;
  
  manifest_files.
  super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  manifest_files.
  super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  manifest_files.
  super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  XVar4 = XR_ERROR_VALIDATION_FAILURE;
  if (api_layer_properties == (XrApiLayerProperties *)0x0 || incoming_count == 0) {
LAB_00105a9a:
    if (outgoing_count == (uint32_t *)0x0) goto LAB_00105b7c;
    XVar2 = ApiLayerManifestFile::FindManifestFiles
                      (openxr_command,MANIFEST_TYPE_IMPLICIT_API_LAYER,&manifest_files);
    if ((XVar2 < XR_SUCCESS) ||
       (XVar2 = ApiLayerManifestFile::FindManifestFiles
                          (openxr_command,MANIFEST_TYPE_EXPLICIT_API_LAYER,&manifest_files),
       XVar2 < XR_SUCCESS)) {
      std::__cxx11::string::string
                ((string *)&local_a8,
                 "ApiLayerInterface::GetApiLayerProperties - failed searching for API layer manifest files"
                 ,(allocator *)&local_68);
      local_88._M_dataplus._M_p = (pointer)0x0;
      local_88._M_string_length = 0;
      local_88.field_2._M_allocated_capacity = 0;
      LoaderLogger::LogErrorMessage
                (openxr_command,&local_a8,
                 (vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)&local_88);
      XVar4 = XVar2;
      goto LAB_00105b68;
    }
    uVar5 = (long)manifest_files.
                  super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)manifest_files.
                  super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3;
    if (0xfffffffe < uVar5) {
      std::__cxx11::string::string
                ((string *)&local_a8,
                 "ApiLayerInterface::GetApiLayerProperties - too many API layers found",
                 (allocator *)&local_68);
      local_88._M_dataplus._M_p = (pointer)0x0;
      local_88._M_string_length = 0;
      local_88.field_2._M_allocated_capacity = 0;
      LoaderLogger::LogErrorMessage
                (openxr_command,&local_a8,
                 (vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)&local_88);
      std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector
                ((vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)&local_88);
      std::__cxx11::string::~string((string *)&local_a8);
      XVar4 = XR_ERROR_RUNTIME_FAILURE;
      goto LAB_00105b7c;
    }
    *outgoing_count = (uint)uVar5;
    if (incoming_count == 0) {
      XVar4 = XR_SUCCESS;
      goto LAB_00105b7c;
    }
    if (api_layer_properties != (XrApiLayerProperties *)0x0) {
      if (incoming_count < (uint)uVar5) {
        std::__cxx11::string::string
                  ((string *)&local_a8,"xrEnumerateInstanceExtensionProperties",&local_a9);
        std::__cxx11::string::string
                  ((string *)&local_88,
                   "VUID-xrEnumerateApiLayerProperties-propertyCapacityInput-parameter: insufficient space in array"
                   ,&local_aa);
        local_68.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl
        .super__Vector_impl_data._M_start = (pointer)0x0;
        local_68.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl
        .super__Vector_impl_data._M_finish = (pointer)0x0;
        local_68.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        LoaderLogger::LogErrorMessage(&local_a8,&local_88,&local_68);
        std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector(&local_68);
        std::__cxx11::string::~string((string *)&local_88);
        std::__cxx11::string::~string((string *)&local_a8);
        XVar4 = XR_ERROR_SIZE_INSUFFICIENT;
      }
      else {
        XVar4 = XR_SUCCESS;
        for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
          ApiLayerManifestFile::PopulateApiLayerProperties
                    (manifest_files.
                     super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar6]._M_t.
                     super___uniq_ptr_impl<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_ApiLayerManifestFile_*,_std::default_delete<ApiLayerManifestFile>_>
                     .super__Head_base<0UL,_ApiLayerManifestFile_*,_false>._M_head_impl,
                     api_layer_properties);
          api_layer_properties = api_layer_properties + 1;
        }
      }
      goto LAB_00105b7c;
    }
    std::__cxx11::string::string
              ((string *)&local_a8,"xrEnumerateInstanceExtensionProperties",&local_a9);
    std::__cxx11::string::string
              ((string *)&local_88,
               "VUID-xrEnumerateApiLayerProperties-properties-parameter: non-zero capacity but null array"
               ,&local_aa);
    local_68.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    LoaderLogger::LogErrorMessage(&local_a8,&local_88,&local_68);
    std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector(&local_68);
    std::__cxx11::string::~string((string *)&local_88);
  }
  else {
    lVar3 = 0;
    do {
      if ((ulong)incoming_count * 0x220 + 0x220 == lVar3 + 0x220) goto LAB_00105a9a;
      lVar1 = lVar3 + -0x10;
      lVar3 = lVar3 + 0x220;
    } while (*(int *)(api_layer_properties->layerName + lVar1) == 1);
    std::__cxx11::string::string
              ((string *)&local_a8,
               "VUID-XrApiLayerProperties-type-type: unknown type in api_layer_properties",
               (allocator *)&local_68);
    local_88._M_dataplus._M_p = (pointer)0x0;
    local_88._M_string_length = 0;
    local_88.field_2._M_allocated_capacity = 0;
    LoaderLogger::LogErrorMessage
              (openxr_command,&local_a8,
               (vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)&local_88);
LAB_00105b68:
    std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector
              ((vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)&local_88);
  }
  std::__cxx11::string::~string((string *)&local_a8);
LAB_00105b7c:
  std::
  vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
  ::~vector(&manifest_files);
  return XVar4;
}

Assistant:

XrResult ApiLayerInterface::GetApiLayerProperties(const std::string& openxr_command, uint32_t incoming_count,
                                                  uint32_t* outgoing_count, XrApiLayerProperties* api_layer_properties) {
    std::vector<std::unique_ptr<ApiLayerManifestFile>> manifest_files;
    uint32_t manifest_count = 0;
    // Validate props struct before proceeding
    if (0 < incoming_count && nullptr != api_layer_properties) {
        for (uint32_t i = 0; i < incoming_count; i++) {
            if (XR_TYPE_API_LAYER_PROPERTIES != api_layer_properties[i].type) {
                LoaderLogger::LogErrorMessage(openxr_command,
                                              "VUID-XrApiLayerProperties-type-type: unknown type in api_layer_properties");
                return XR_ERROR_VALIDATION_FAILURE;
            }
        }
    }

    // "Independent of elementCapacityInput or elements parameters, elementCountOutput must be a valid pointer,
    // and the function sets elementCountOutput." - 2.11
    if (nullptr == outgoing_count) {
        return XR_ERROR_VALIDATION_FAILURE;
    }

    // Find any implicit layers which we may need to report information for.
    XrResult result = ApiLayerManifestFile::FindManifestFiles(openxr_command, MANIFEST_TYPE_IMPLICIT_API_LAYER, manifest_files);
    if (XR_SUCCEEDED(result)) {
        // Find any explicit layers which we may need to report information for.
        result = ApiLayerManifestFile::FindManifestFiles(openxr_command, MANIFEST_TYPE_EXPLICIT_API_LAYER, manifest_files);
    }
    if (XR_FAILED(result)) {
        LoaderLogger::LogErrorMessage(openxr_command,
                                      "ApiLayerInterface::GetApiLayerProperties - failed searching for API layer manifest files");
        return result;
    }

    // check for potential overflow before static_cast<uint32_t>
    if (manifest_files.size() >= UINT32_MAX) {
        LoaderLogger::LogErrorMessage(openxr_command, "ApiLayerInterface::GetApiLayerProperties - too many API layers found");
        return XR_ERROR_RUNTIME_FAILURE;
    }

    manifest_count = static_cast<uint32_t>(manifest_files.size());
    if (nullptr == outgoing_count) {
        LoaderLogger::LogErrorMessage("xrEnumerateInstanceExtensionProperties",
                                      "VUID-xrEnumerateApiLayerProperties-propertyCountOutput-parameter: null propertyCountOutput");
        return XR_ERROR_VALIDATION_FAILURE;
    }

    *outgoing_count = manifest_count;
    if (0 == incoming_count) {
        // capacity check only
        return XR_SUCCESS;
    }
    if (nullptr == api_layer_properties) {
        // incoming_count is not 0 BUT the api_layer_properties is NULL
        LoaderLogger::LogErrorMessage("xrEnumerateInstanceExtensionProperties",
                                      "VUID-xrEnumerateApiLayerProperties-properties-parameter: non-zero capacity but null array");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    if (incoming_count < manifest_count) {
        LoaderLogger::LogErrorMessage(
            "xrEnumerateInstanceExtensionProperties",
            "VUID-xrEnumerateApiLayerProperties-propertyCapacityInput-parameter: insufficient space in array");
        return XR_ERROR_SIZE_INSUFFICIENT;
    }

    for (uint32_t prop = 0; prop < incoming_count && prop < manifest_count; ++prop) {
        manifest_files[prop]->PopulateApiLayerProperties(api_layer_properties[prop]);
    }
    return XR_SUCCESS;
}